

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::anon_unknown_2::
         LegacyGeneratedClassName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc)

{
  EnumDescriptor *pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string classname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&classname,*(string **)(desc + 8));
  pEVar1 = desc;
  while (pEVar1 = *(EnumDescriptor **)(pEVar1 + 0x18), pEVar1 != (EnumDescriptor *)0x0) {
    std::operator+(&local_50,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (pEVar1 + 8),'_');
    std::operator+(&local_90,&local_50,&classname);
    std::__cxx11::string::operator=((string *)&classname,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_90,&classname,desc);
  std::operator+(__return_storage_ptr__,&local_90,&classname);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&classname);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyGeneratedClassName(const DescriptorType* desc) {
  std::string classname = desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = containing->name() + '_' + classname;
    containing = containing->containing_type();
  }
  return ClassNamePrefix(classname, desc) + classname;
}